

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::sse42::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  long *plVar7;
  long lVar8;
  float *pfVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  undefined8 uVar11;
  ulong uVar12;
  _func_int *p_Var13;
  long lVar14;
  float fVar15;
  undefined1 in_XMM0 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar21;
  float fVar22;
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  vfloat4 l02;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar30;
  float fVar31;
  undefined1 in_XMM4 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar39 [12];
  float fVar41;
  float fVar42;
  undefined1 in_XMM5 [16];
  undefined1 auVar40 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  float fVar48;
  float fVar49;
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 in_XMM11 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 in_XMM12 [16];
  float fVar54;
  float fVar55;
  RayQueryContext newcontext;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar25 [16];
  
  auVar39 = in_XMM5._0_12_;
  uVar3 = prim->primID_;
  pGVar5 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var13 = *(_func_int **)&pGVar5->field_0x58;
  if (p_Var13 == (_func_int *)0x0) {
    uVar12 = (ulong)*(uint *)(*(long *)&pGVar5[1].time_range.upper +
                             (long)pGVar5[1].intersectionFilterN * (ulong)uVar3);
    if (uVar12 == 0xffffffff) {
      p_Var13 = (_func_int *)0x0;
    }
    else {
      p_Var13 = pGVar5[1].super_RefCount._vptr_RefCount[uVar12];
    }
  }
  if (((p_Var13 != (_func_int *)0x0) && (((ray->super_RayK<1>).mask & pGVar5->mask) != 0)) &&
     (pRVar6 = context->user, pRVar6->instID[0] == 0xffffffff)) {
    pRVar6->instID[0] = prim->instID_;
    pRVar6->instPrimID[0] = uVar3;
    uVar12 = (ulong)prim->primID_;
    plVar7 = *(long **)&pGVar5[1].fnumTimeSegments;
    iVar4 = (int)plVar7[4];
    if ((pGVar5->field_8).field_0x1 == '\x01') {
      if (iVar4 == 0x9134) {
        lVar8 = *plVar7;
        lVar14 = uVar12 * plVar7[2];
        auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + lVar14)),*(undefined4 *)(lVar8 + 0x10 + lVar14)
                           ,0x1c);
        in_XMM0 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x20 + lVar14),0x28);
        auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar14)),
                           *(undefined4 *)(lVar8 + 0x14 + lVar14),0x1c);
        in_XMM12 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x24 + lVar14),0x28);
        auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar14)),
                           *(undefined4 *)(lVar8 + 0x18 + lVar14),0x1c);
        in_XMM11 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x28 + lVar14),0x28);
        auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                           *(undefined4 *)(lVar8 + 0x1c + lVar14),0x1c);
        in_XMM1 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x2c + lVar14),0x28);
      }
      else if (iVar4 == 0x9234) {
        lVar8 = *plVar7;
        lVar14 = uVar12 * plVar7[2];
        uVar2 = *(undefined8 *)(lVar8 + 4 + lVar14);
        in_XMM0._4_4_ = (float)(int)uVar2;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar8 + lVar14);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar2 = *(undefined8 *)(lVar8 + 0x10 + lVar14);
        in_XMM12._4_4_ = (int)uVar2;
        in_XMM12._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar14);
        in_XMM12._8_4_ = (int)((ulong)uVar2 >> 0x20);
        in_XMM12._12_4_ = 0;
        uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
        in_XMM11._4_4_ = (int)uVar2;
        in_XMM11._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
        in_XMM11._8_4_ = (int)((ulong)uVar2 >> 0x20);
        in_XMM11._12_4_ = 0;
        uVar2 = *(undefined8 *)(lVar8 + 0x28 + lVar14);
        in_XMM1._4_4_ = (int)uVar2;
        in_XMM1._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar14);
        in_XMM1._8_4_ = (int)((ulong)uVar2 >> 0x20);
        in_XMM1._12_4_ = 0;
      }
      else if (iVar4 == 0xb001) {
        lVar8 = *plVar7;
        lVar14 = uVar12 * plVar7[2];
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar14);
        auVar52 = insertps(auVar52,*(undefined4 *)(lVar8 + 8 + lVar14),0x20);
        uVar2 = *(undefined8 *)(lVar8 + 0x34 + lVar14);
        auVar17._4_4_ = (int)uVar2;
        auVar17._0_4_ = *(undefined4 *)(lVar8 + lVar14);
        auVar17._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar17._12_4_ = 0;
        uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
        auVar34._4_4_ = (int)uVar2;
        auVar34._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
        auVar34._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar34._12_4_ = 0;
        fVar15 = *(float *)(lVar8 + 0x24 + lVar14);
        fVar31 = *(float *)(lVar8 + 0x28 + lVar14);
        fVar38 = *(float *)(lVar8 + 0x2c + lVar14);
        fVar21 = *(float *)(lVar8 + 0x30 + lVar14);
        fVar43 = fVar21 * fVar21 + fVar38 * fVar38 + fVar15 * fVar15 + fVar31 * fVar31;
        auVar27 = rsqrtss(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
        fVar22 = auVar27._0_4_;
        fVar22 = fVar22 * fVar22 * fVar43 * -0.5 * fVar22 + fVar22 * 1.5;
        in_XMM1 = insertps(auVar34,ZEXT416((uint)(fVar15 * fVar22)),0x30);
        in_XMM0 = insertps(auVar17,ZEXT416((uint)(fVar31 * fVar22)),0x30);
        auVar27._0_4_ = fVar22 * fVar21;
        auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                           *(undefined4 *)(lVar8 + 4 + lVar14),0x10);
        in_XMM11 = insertps(auVar52,auVar27,0x30);
        auVar17 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x3c + lVar14),0x20);
        in_XMM12 = insertps(auVar17,ZEXT416((uint)(fVar38 * fVar22)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar8 = *plVar7;
        lVar14 = uVar12 * plVar7[2];
        in_XMM0 = *(undefined1 (*) [16])(lVar8 + lVar14);
        in_XMM12 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar14);
        in_XMM11 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar14);
        in_XMM1 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar14);
      }
      fVar38 = in_XMM1._12_4_;
      fVar15 = in_XMM0._0_4_;
      fVar31 = in_XMM0._12_4_;
      fVar37 = in_XMM12._0_4_;
      fVar41 = in_XMM12._4_4_;
      fVar46 = in_XMM12._12_4_;
      fVar28 = in_XMM11._0_4_;
      fVar29 = in_XMM11._4_4_;
      fVar30 = in_XMM11._8_4_;
      fVar44 = in_XMM11._12_4_;
      fVar43 = fVar31 * fVar46 + fVar44 * fVar38;
      fVar21 = fVar31 * fVar46 - fVar44 * fVar38;
      fVar22 = fVar38 * fVar38 + fVar31 * fVar31 + -fVar46 * fVar46 + -fVar44 * fVar44;
      fVar54 = fVar38 * fVar38 - fVar31 * fVar31;
      fVar51 = fVar46 * fVar46 + fVar54 + -fVar44 * fVar44;
      fVar55 = fVar31 * fVar44 - fVar46 * fVar38;
      fVar45 = fVar46 * fVar38 + fVar31 * fVar44;
      fVar53 = fVar46 * fVar44 + fVar31 * fVar38;
      fVar31 = fVar46 * fVar44 - fVar31 * fVar38;
      fVar43 = fVar43 + fVar43;
      fVar55 = fVar55 + fVar55;
      fVar38 = fVar44 * fVar44 + fVar54 + -fVar46 * fVar46;
      fVar54 = fVar22 * 1.0 + fVar43 * 0.0 + fVar55 * 0.0;
      fVar48 = fVar22 * 0.0 + fVar43 * 1.0 + fVar55 * 0.0;
      fVar49 = fVar22 * 0.0 + fVar43 * 0.0 + fVar55 * 1.0;
      fVar55 = fVar22 * 0.0 + fVar43 * 0.0 + fVar55 * 0.0;
      fVar53 = fVar53 + fVar53;
      fVar21 = fVar21 + fVar21;
      fVar22 = fVar21 * 1.0 + fVar51 * 0.0 + fVar53 * 0.0;
      fVar43 = fVar21 * 0.0 + fVar51 * 1.0 + fVar53 * 0.0;
      fVar44 = fVar21 * 0.0 + fVar51 * 0.0 + fVar53 * 1.0;
      fVar21 = fVar21 * 0.0 + fVar51 * 0.0 + fVar53 * 0.0;
      auVar50._0_8_ = in_XMM0._4_8_;
      auVar50._8_8_ = 0;
      auVar17 = blendps(auVar50,in_XMM12,4);
      fVar45 = fVar45 + fVar45;
      fVar31 = fVar31 + fVar31;
      fVar51 = fVar45 * 1.0 + fVar31 * 0.0 + fVar38 * 0.0;
      fVar53 = fVar45 * 0.0 + fVar31 * 1.0 + fVar38 * 0.0;
      fVar46 = fVar45 * 0.0 + fVar31 * 0.0 + fVar38 * 1.0;
      fVar38 = fVar45 * 0.0 + fVar31 * 0.0 + fVar38 * 0.0;
      local_48._0_4_ = in_XMM1._0_4_;
      local_48._4_4_ = in_XMM1._4_4_;
      uStack_40._0_4_ = in_XMM1._8_4_;
      fVar31 = fVar38 * 0.0;
      in_XMM0._0_4_ = fVar15 * fVar54 + fVar22 * 0.0 + fVar51 * 0.0;
      in_XMM0._4_4_ = fVar15 * fVar48 + fVar43 * 0.0 + fVar53 * 0.0;
      in_XMM0._8_4_ = fVar15 * fVar49 + fVar44 * 0.0 + fVar46 * 0.0;
      in_XMM0._12_4_ = fVar15 * fVar55 + fVar21 * 0.0 + fVar31;
      in_XMM7._0_4_ = fVar37 * fVar54 + fVar41 * fVar22 + fVar51 * 0.0;
      in_XMM7._4_4_ = fVar37 * fVar48 + fVar41 * fVar43 + fVar53 * 0.0;
      in_XMM7._8_4_ = fVar37 * fVar49 + fVar41 * fVar44 + fVar46 * 0.0;
      in_XMM7._12_4_ = fVar37 * fVar55 + fVar41 * fVar21 + fVar31;
      in_XMM4._0_4_ = fVar28 * fVar54 + fVar29 * fVar22 + fVar30 * fVar51;
      in_XMM4._4_4_ = fVar28 * fVar48 + fVar29 * fVar43 + fVar30 * fVar53;
      in_XMM4._8_4_ = fVar28 * fVar49 + fVar29 * fVar44 + fVar30 * fVar46;
      in_XMM4._12_4_ = fVar28 * fVar55 + fVar29 * fVar21 + fVar30 * fVar38;
      auVar39._0_4_ =
           (float)local_48 * fVar54 + local_48._4_4_ * fVar22 + (float)uStack_40 * fVar51 +
           auVar17._0_4_ + 0.0;
      auVar39._4_4_ =
           (float)local_48 * fVar48 + local_48._4_4_ * fVar43 + (float)uStack_40 * fVar53 +
           auVar17._4_4_ + 0.0;
      auVar39._8_4_ =
           (float)local_48 * fVar49 + local_48._4_4_ * fVar44 + (float)uStack_40 * fVar46 +
           auVar17._8_4_ + 0.0;
    }
    else if (iVar4 == 0x9134) {
      lVar8 = *plVar7;
      lVar14 = uVar12 * plVar7[2];
      auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + lVar14)),*(undefined4 *)(lVar8 + 0x10 + lVar14),
                         0x1c);
      in_XMM0 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x20 + lVar14),0x28);
      auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar14)),
                         *(undefined4 *)(lVar8 + 0x14 + lVar14),0x1c);
      in_XMM7 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x24 + lVar14),0x28);
      auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar14)),
                         *(undefined4 *)(lVar8 + 0x18 + lVar14),0x1c);
      in_XMM4 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x28 + lVar14),0x28);
      auVar17 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                         *(undefined4 *)(lVar8 + 0x1c + lVar14),0x1c);
      auVar17 = insertps(auVar17,*(undefined4 *)(lVar8 + 0x2c + lVar14),0x28);
      auVar39 = auVar17._0_12_;
    }
    else if (iVar4 == 0x9234) {
      lVar8 = *plVar7;
      lVar14 = uVar12 * plVar7[2];
      uVar2 = *(undefined8 *)(lVar8 + 4 + lVar14);
      in_XMM0._4_4_ = (float)(int)uVar2;
      in_XMM0._0_4_ = (float)*(undefined4 *)(lVar8 + lVar14);
      in_XMM0._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
      in_XMM0._12_4_ = 0.0;
      uVar2 = *(undefined8 *)(lVar8 + 0x10 + lVar14);
      in_XMM7._4_4_ = (float)(int)uVar2;
      in_XMM7._0_4_ = (float)*(undefined4 *)(lVar8 + 0xc + lVar14);
      in_XMM7._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
      in_XMM7._12_4_ = 0.0;
      uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
      in_XMM4._4_4_ = (float)(int)uVar2;
      in_XMM4._0_4_ = (float)*(undefined4 *)(lVar8 + 0x18 + lVar14);
      in_XMM4._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
      in_XMM4._12_4_ = 0.0;
      uVar2 = *(undefined8 *)(lVar8 + 0x28 + lVar14);
      auVar39._4_4_ = (float)(int)uVar2;
      auVar39._0_4_ = (float)*(undefined4 *)(lVar8 + 0x24 + lVar14);
      auVar39._8_4_ = (float)(int)((ulong)uVar2 >> 0x20);
    }
    else if (iVar4 == 0xb001) {
      lVar8 = *plVar7;
      lVar14 = uVar12 * plVar7[2];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar14);
      auVar17 = insertps(auVar32,*(undefined4 *)(lVar8 + 8 + lVar14),0x20);
      uVar2 = *(undefined8 *)(lVar8 + 0x34 + lVar14);
      auVar16._4_4_ = (int)uVar2;
      auVar16._0_4_ = *(undefined4 *)(lVar8 + lVar14);
      auVar16._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar16._12_4_ = 0;
      uVar2 = *(undefined8 *)(lVar8 + 0x1c + lVar14);
      auVar40._4_4_ = (int)uVar2;
      auVar40._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar14);
      auVar40._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar40._12_4_ = 0;
      fVar15 = *(float *)(lVar8 + 0x24 + lVar14);
      fVar31 = *(float *)(lVar8 + 0x28 + lVar14);
      fVar38 = *(float *)(lVar8 + 0x2c + lVar14);
      fVar21 = *(float *)(lVar8 + 0x30 + lVar14);
      fVar43 = fVar21 * fVar21 + fVar38 * fVar38 + fVar15 * fVar15 + fVar31 * fVar31;
      auVar34 = rsqrtss(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
      fVar22 = auVar34._0_4_;
      auVar47._4_12_ = auVar34._4_12_;
      fVar22 = fVar22 * fVar22 * fVar43 * -0.5 * fVar22 + fVar22 * 1.5;
      auVar34 = insertps(auVar40,ZEXT416((uint)(fVar15 * fVar22)),0x30);
      auVar39 = auVar34._0_12_;
      in_XMM0 = insertps(auVar16,ZEXT416((uint)(fVar31 * fVar22)),0x30);
      auVar47._0_4_ = fVar22 * fVar21;
      auVar34 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar14)),
                         *(undefined4 *)(lVar8 + 4 + lVar14),0x10);
      in_XMM4 = insertps(auVar17,auVar47,0x30);
      auVar17 = insertps(auVar34,*(undefined4 *)(lVar8 + 0x3c + lVar14),0x20);
      in_XMM7 = insertps(auVar17,ZEXT416((uint)(fVar38 * fVar22)),0x30);
    }
    else if (iVar4 == 0x9244) {
      lVar8 = *plVar7;
      lVar14 = uVar12 * plVar7[2];
      in_XMM0 = *(undefined1 (*) [16])(lVar8 + lVar14);
      in_XMM7 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar14);
      in_XMM4 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar14);
      auVar39 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar14),0);
    }
    fVar43 = in_XMM4._0_4_;
    fVar44 = in_XMM4._4_4_;
    fVar45 = in_XMM4._8_4_;
    fVar51 = in_XMM4._12_4_;
    fVar53 = in_XMM7._0_4_;
    fVar46 = in_XMM7._4_4_;
    fVar54 = in_XMM7._8_4_;
    fVar15 = in_XMM0._0_4_;
    fVar31 = in_XMM0._4_4_;
    fVar38 = in_XMM0._8_4_;
    auVar20._0_4_ = fVar53 * fVar44 - fVar46 * fVar43;
    fVar21 = fVar46 * fVar45 - fVar54 * fVar44;
    fVar22 = fVar54 * fVar43 - fVar53 * fVar45;
    auVar23._4_4_ = fVar22;
    auVar23._0_4_ = fVar21;
    auVar23._8_4_ = auVar20._0_4_;
    auVar23._12_4_ = in_XMM7._12_4_ * fVar51 - in_XMM7._12_4_ * fVar51;
    auVar33._0_4_ = fVar43 * fVar31 - fVar44 * fVar15;
    auVar33._4_4_ = fVar44 * fVar38 - fVar45 * fVar31;
    auVar33._8_4_ = fVar45 * fVar15 - fVar43 * fVar38;
    auVar33._12_4_ = fVar51 * in_XMM0._12_4_ - fVar51 * in_XMM0._12_4_;
    fVar43 = fVar31 * fVar54 - fVar38 * fVar46;
    auVar17 = dpps(in_XMM0,auVar23,0x7f);
    auVar34 = insertps(auVar33,auVar33,0x4a);
    auVar20._4_4_ = auVar33._0_4_;
    auVar20._8_4_ = fVar15 * fVar46 - fVar31 * fVar53;
    auVar20._12_4_ = 0;
    auVar26._4_4_ = fVar43;
    auVar26._0_4_ = fVar21;
    auVar26._8_4_ = fVar43;
    auVar26._12_4_ = auVar34._4_4_;
    auVar25._8_8_ = auVar26._8_8_;
    auVar25._4_4_ = auVar34._0_4_;
    auVar25._0_4_ = fVar21;
    auVar24._4_4_ = auVar34._8_4_;
    auVar24._0_4_ = fVar22;
    auVar24._8_4_ = fVar38 * fVar53 - fVar15 * fVar54;
    auVar24._12_4_ = auVar34._12_4_;
    auVar18._0_4_ = auVar17._0_4_;
    auVar18._4_4_ = auVar18._0_4_;
    auVar18._8_4_ = auVar18._0_4_;
    auVar18._12_4_ = auVar18._0_4_;
    auVar27 = divps(auVar25,auVar18);
    auVar34 = divps(auVar24,auVar18);
    auVar17 = divps(auVar20,auVar18);
    fVar37 = auVar39._0_4_;
    fVar41 = auVar39._4_4_;
    fVar42 = auVar39._8_4_;
    fVar44 = auVar17._0_4_;
    fVar45 = auVar17._4_4_;
    fVar51 = auVar17._8_4_;
    fVar53 = auVar17._12_4_;
    fVar46 = auVar34._0_4_;
    fVar54 = auVar34._4_4_;
    fVar48 = auVar34._8_4_;
    fVar49 = auVar34._12_4_;
    fVar55 = auVar27._0_4_;
    fVar28 = auVar27._4_4_;
    fVar29 = auVar27._8_4_;
    fVar30 = auVar27._12_4_;
    fVar15 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar31 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar38 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar39 = *(undefined1 (*) [12])&(ray->super_RayK<1>).org.field_0;
    aVar10 = (ray->super_RayK<1>).org.field_0;
    pVVar1 = &(ray->super_RayK<1>).dir;
    fVar21 = (pVVar1->field_0).m128[0];
    fVar22 = (ray->super_RayK<1>).dir.field_0.m128[1];
    uVar2 = *(undefined8 *)&pVVar1->field_0;
    pfVar9 = (ray->super_RayK<1>).dir.field_0.m128 + 2;
    fVar43 = *pfVar9;
    uVar11 = *(undefined8 *)pfVar9;
    auVar35._0_4_ =
         fVar15 * fVar55 +
         fVar31 * fVar46 + (fVar38 * fVar44 - (fVar37 * fVar55 + fVar41 * fVar46 + fVar42 * fVar44))
    ;
    auVar35._4_4_ =
         fVar15 * fVar28 +
         fVar31 * fVar54 + (fVar38 * fVar45 - (fVar37 * fVar28 + fVar41 * fVar54 + fVar42 * fVar45))
    ;
    auVar35._8_4_ =
         fVar15 * fVar29 +
         fVar31 * fVar48 + (fVar38 * fVar51 - (fVar37 * fVar29 + fVar41 * fVar48 + fVar42 * fVar51))
    ;
    auVar35._12_4_ =
         fVar15 * fVar30 +
         fVar31 * fVar49 + (fVar38 * fVar53 - (fVar37 * fVar30 + fVar41 * fVar49 + fVar42 * fVar53))
    ;
    aVar36 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar35,(ray->super_RayK<1>).org.field_0.m128[3],0x30);
    (ray->super_RayK<1>).org.field_0 = aVar36;
    auVar19._0_4_ = fVar21 * fVar55 + fVar22 * fVar46 + fVar43 * fVar44;
    auVar19._4_4_ = fVar21 * fVar28 + fVar22 * fVar54 + fVar43 * fVar45;
    auVar19._8_4_ = fVar21 * fVar29 + fVar22 * fVar48 + fVar43 * fVar51;
    auVar19._12_4_ = fVar21 * fVar30 + fVar22 * fVar49 + fVar43 * fVar53;
    aVar36 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar19,(ray->super_RayK<1>).dir.field_0.m128[3],0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar36;
    (**(code **)(p_Var13 + 0x78))(p_Var13 + 0x58,ray);
    local_48 = auVar39._0_8_;
    uStack_40 = aVar10._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_48;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_40;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = uVar2;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uVar11;
    pRVar6->instID[0] = 0xffffffff;
    pRVar6->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }